

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

char8_t * fmt::v8::detail::
          parse_precision<char8_t,fmt::v8::detail::specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::basic_format_parse_context<char8_t,fmt::v8::detail::error_handler>>>&>
                    (char8_t *begin,char8_t *end,
                    specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::basic_format_parse_context<char8_t,_fmt::v8::detail::error_handler>_>_>
                    *handler)

{
  byte *pbVar1;
  byte bVar2;
  basic_format_parse_context<char8_t,_fmt::v8::detail::error_handler> *pbVar3;
  dynamic_format_specs<char8_t> *pdVar4;
  uint uVar5;
  int iVar6;
  byte *local_20;
  precision_adapter local_18;
  
  local_20 = (byte *)(begin + 1);
  if (local_20 == (byte *)end) {
    uVar5 = 0;
  }
  else {
    uVar5 = (uint)*local_20;
  }
  if (uVar5 - 0x30 < 10) {
    iVar6 = parse_nonnegative_int<char8_t>((char8_t **)&local_20,end,-1);
    if (iVar6 == -1) {
      fmt::v8::detail::throw_format_error("number is too big");
    }
    ((handler->
     super_dynamic_specs_handler<fmt::v8::basic_format_parse_context<char8_t,_fmt::v8::detail::error_handler>_>
     ).super_specs_setter<char8_t>.specs_)->precision = iVar6;
  }
  else {
    if (uVar5 != 0x7b) {
      fmt::v8::detail::throw_format_error("missing precision specifier");
    }
    local_20 = (byte *)(begin + 2);
    if (local_20 != (byte *)end) {
      local_18.handler = handler;
      if ((*local_20 == 0x3a) || (*local_20 == 0x7d)) {
        pbVar3 = (handler->
                 super_dynamic_specs_handler<fmt::v8::basic_format_parse_context<char8_t,_fmt::v8::detail::error_handler>_>
                 ).context_;
        iVar6 = pbVar3->next_arg_id_;
        if (iVar6 < 0) {
          fmt::v8::detail::throw_format_error
                    ("cannot switch from manual to automatic argument indexing");
        }
        pbVar3->next_arg_id_ = iVar6 + 1;
        pdVar4 = (handler->
                 super_dynamic_specs_handler<fmt::v8::basic_format_parse_context<char8_t,_fmt::v8::detail::error_handler>_>
                 ).specs_;
        (pdVar4->precision_ref).kind = index;
        (pdVar4->precision_ref).val.index = iVar6;
      }
      else {
        local_20 = (byte *)do_parse_arg_id<char8_t,fmt::v8::detail::parse_precision<char8_t,fmt::v8::detail::specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::basic_format_parse_context<char8_t,fmt::v8::detail::error_handler>>>&>(char8_t_const*,char8_t_const*,fmt::v8::detail::specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::basic_format_parse_context<char8_t,fmt::v8::detail::error_handler>>>&)::precision_adapter&>
                                     ((char8_t *)local_20,end,&local_18);
      }
    }
    if ((local_20 == (byte *)end) ||
       (pbVar1 = local_20 + 1, bVar2 = *local_20, local_20 = pbVar1, bVar2 != 0x7d)) {
      fmt::v8::detail::throw_format_error("invalid format string");
    }
  }
  if ((handler->arg_type_ < custom_type) && ((0x41feU >> (handler->arg_type_ & 0x1f) & 1) != 0)) {
    fmt::v8::detail::throw_format_error("precision not allowed for this argument type");
  }
  return (char8_t *)local_20;
}

Assistant:

FMT_CONSTEXPR auto parse_precision(const Char* begin, const Char* end,
                                   Handler&& handler) -> const Char* {
  using detail::auto_id;
  struct precision_adapter {
    Handler& handler;

    FMT_CONSTEXPR void operator()() { handler.on_dynamic_precision(auto_id()); }
    FMT_CONSTEXPR void operator()(int id) { handler.on_dynamic_precision(id); }
    FMT_CONSTEXPR void operator()(basic_string_view<Char> id) {
      handler.on_dynamic_precision(id);
    }
    FMT_CONSTEXPR void on_error(const char* message) {
      if (message) handler.on_error(message);
    }
  };

  ++begin;
  auto c = begin != end ? *begin : Char();
  if ('0' <= c && c <= '9') {
    auto precision = parse_nonnegative_int(begin, end, -1);
    if (precision != -1)
      handler.on_precision(precision);
    else
      handler.on_error("number is too big");
  } else if (c == '{') {
    ++begin;
    if (begin != end)
      begin = parse_arg_id(begin, end, precision_adapter{handler});
    if (begin == end || *begin++ != '}')
      return handler.on_error("invalid format string"), begin;
  } else {
    return handler.on_error("missing precision specifier"), begin;
  }
  handler.end_precision();
  return begin;
}